

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleComboBox::text(QString *__return_storage_ptr__,QAccessibleComboBox *this,Text t)

{
  bool bVar1;
  QComboBox *this_00;
  QLineEdit *this_01;
  char16_t *tmp_1;
  char16_t *pcVar2;
  QTypedArrayData<char16_t> *tmp;
  qsizetype qVar3;
  long in_FS_OFFSET;
  Data *local_70;
  QKeySequence local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = comboBox(this);
  if (this_00 == (QComboBox *)0x0) goto LAB_004cb990;
  if (t == Name) {
LAB_004cb82b:
    bVar1 = QComboBox::isEditable(this_00);
    if (bVar1) {
      this_01 = QComboBox::lineEdit(this_00);
      QLineEdit::text((QString *)&local_58,this_01);
      local_70 = local_58.d;
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      (__return_storage_ptr__->d).size = local_58.size;
      pcVar2 = local_58.ptr;
      qVar3 = local_58.size;
    }
    else {
      QComboBox::currentText((QString *)&local_58,this_00);
      local_70 = local_58.d;
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      (__return_storage_ptr__->d).size = local_58.size;
      pcVar2 = local_58.ptr;
      qVar3 = local_58.size;
    }
    local_58.size = 0;
    local_58.ptr = (char16_t *)0x0;
    local_58.d = (Data *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_004cb949:
    if (qVar3 != 0) goto LAB_004cb990;
  }
  else {
    if (t == Accelerator) {
      QKeySequence::QKeySequence(local_60,0x1000015,0,0,0);
      QKeySequence::toString((SequenceFormat)&local_58);
      qVar3 = local_58.size;
      pcVar2 = local_58.ptr;
      local_70 = local_58.d;
      local_58.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = local_70;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      local_58.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_58.size;
      local_58.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QKeySequence::~QKeySequence(local_60);
      goto LAB_004cb949;
    }
    if (t == Value) goto LAB_004cb82b;
    local_70 = (Data *)0x0;
    pcVar2 = (char16_t *)0x0;
  }
  QAccessibleWidget::text((QString *)&local_58,&this->super_QAccessibleWidget,t);
  (__return_storage_ptr__->d).d = local_58.d;
  (__return_storage_ptr__->d).ptr = local_58.ptr;
  (__return_storage_ptr__->d).size = local_58.size;
  local_58.size = 0;
  local_58.d = local_70;
  local_58.ptr = pcVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_004cb990:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleComboBox::text(QAccessible::Text t) const
{
    QString str;
    if (QComboBox *cBox = comboBox()) {
        switch (t) {
        case QAccessible::Name:
#ifndef Q_OS_UNIX // on Linux we use relations for this, name is text (fall through to Value)
        str = QAccessibleWidget::text(t);
        break;
#endif
        case QAccessible::Value:
            if (cBox->isEditable())
                str = cBox->lineEdit()->text();
            else
                str = cBox->currentText();
            break;
#ifndef QT_NO_SHORTCUT
        case QAccessible::Accelerator:
            str = QKeySequence(Qt::Key_Down).toString(QKeySequence::NativeText);
            break;
#endif
        default:
            break;
        }
        if (str.isEmpty())
            str = QAccessibleWidget::text(t);
    }
    return str;
}